

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.h
# Opt level: O0

Error __thiscall
llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract
          (DWARFListTableBase<llvm::DWARFDebugRnglist> *this,DWARFDataExtractor Data,
          uint64_t *OffsetPtr)

{
  DWARFDataExtractor DVar1;
  pointer OffsetPtr_00;
  bool bVar2;
  uint8_t Size;
  uint64_t uVar3;
  uint64_t uVar4;
  mapped_type *this_00;
  ulong *in_RDX;
  size_t in_R9;
  StringRef SVar5;
  StringRef SectionName;
  Error local_f0;
  StringRef local_e8;
  StringRef local_d8;
  char *local_c8;
  size_t sStack_c0;
  undefined8 local_b8;
  DWARFObject *pDStack_b0;
  DWARFSection *local_a8;
  byte local_91;
  ulong local_90;
  uint64_t Off;
  DWARFDebugRnglist CurrentList;
  uint64_t End;
  uint64_t *OffsetPtr_local;
  DWARFListTableBase<llvm::DWARFDebugRnglist> *this_local;
  Error *E;
  
  clear((DWARFListTableBase<llvm::DWARFDebugRnglist> *)OffsetPtr);
  extractHeaderAndOffsets(this,Data,OffsetPtr);
  bVar2 = Error::operator_cast_to_bool((Error *)this);
  if (!bVar2) {
    Error::~Error((Error *)this);
    Size = DWARFListTableHeader::getAddrSize((DWARFListTableHeader *)OffsetPtr);
    DataExtractor::setAddressSize(&Data.super_DataExtractor,Size);
    uVar3 = getHeaderOffset((DWARFListTableBase<llvm::DWARFDebugRnglist> *)OffsetPtr);
    uVar4 = DWARFListTableHeader::length((DWARFListTableHeader *)OffsetPtr);
    CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
    super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(uVar3 + uVar4);
    do {
      if (CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
          super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage <= (pointer)*in_RDX) {
        if ((pointer)*in_RDX ==
            CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
            super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          Error::success();
          Error::Error((Error *)this,&local_f0);
          ErrorSuccess::~ErrorSuccess((ErrorSuccess *)&local_f0);
          return (Error)(ErrorInfoBase *)this;
        }
        __assert_fail("*OffsetPtr == End && \"mismatch between expected length of table and length \" \"of extracted data\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFListTable.h"
                      ,0xd4,
                      "Error llvm::DWARFListTableBase<llvm::DWARFDebugRnglist>::extract(DWARFDataExtractor, uint64_t *) [DWARFListType = llvm::DWARFDebugRnglist]"
                     );
      }
      DWARFDebugRnglist::DWARFDebugRnglist((DWARFDebugRnglist *)&Off);
      DVar1 = Data;
      local_90 = *in_RDX;
      local_91 = 0;
      local_a8 = Data.Section;
      local_c8 = Data.super_DataExtractor.Data.Data;
      sStack_c0 = Data.super_DataExtractor.Data.Length;
      local_b8._0_1_ = Data.super_DataExtractor.IsLittleEndian;
      local_b8._1_1_ = Data.super_DataExtractor.AddressSize;
      local_b8._2_6_ = Data.super_DataExtractor._18_6_;
      Data.Obj = DVar1.Obj;
      pDStack_b0 = Data.Obj;
      Data = DVar1;
      uVar3 = getHeaderOffset((DWARFListTableBase<llvm::DWARFDebugRnglist> *)OffsetPtr);
      OffsetPtr_00 = CurrentList.super_DWARFListType<llvm::RangeListEntry>.Entries.
                     super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      SVar5 = DWARFListTableHeader::getSectionName((DWARFListTableHeader *)OffsetPtr);
      local_d8 = SVar5;
      SVar5 = DWARFListTableHeader::getListTypeString((DWARFListTableHeader *)OffsetPtr);
      DVar1.super_DataExtractor.Data.Length = sStack_c0;
      DVar1.super_DataExtractor.Data.Data = local_c8;
      DVar1.super_DataExtractor.IsLittleEndian = (uint8_t)local_b8;
      DVar1.super_DataExtractor.AddressSize = local_b8._1_1_;
      DVar1.super_DataExtractor._18_6_ = local_b8._2_6_;
      DVar1.Obj = pDStack_b0;
      DVar1.Section = local_a8;
      SectionName.Length = in_R9;
      SectionName.Data = (char *)in_RDX;
      local_e8 = SVar5;
      DWARFListType<llvm::RangeListEntry>::extract
                ((DWARFListType<llvm::RangeListEntry> *)this,DVar1,(uint64_t)&Off,uVar3,
                 (uint64_t *)OffsetPtr_00,SectionName,local_d8);
      bVar2 = Error::operator_cast_to_bool((Error *)this);
      if (bVar2) {
        local_91 = 1;
      }
      if ((local_91 & 1) == 0) {
        Error::~Error((Error *)this);
      }
      if (!bVar2) {
        this_00 = std::
                  map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                  ::operator[]((map<unsigned_long,_llvm::DWARFDebugRnglist,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_llvm::DWARFDebugRnglist>_>_>
                                *)(OffsetPtr + 0xb),&local_90);
        DWARFDebugRnglist::operator=(this_00,(DWARFDebugRnglist *)&Off);
        bVar2 = false;
      }
      DWARFDebugRnglist::~DWARFDebugRnglist((DWARFDebugRnglist *)&Off);
    } while (bVar2 == false);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFListTableBase<DWARFListType>::extract(DWARFDataExtractor Data,
                                                 uint64_t *OffsetPtr) {
  clear();
  if (Error E = extractHeaderAndOffsets(Data, OffsetPtr))
    return E;

  Data.setAddressSize(Header.getAddrSize());
  uint64_t End = getHeaderOffset() + Header.length();
  while (*OffsetPtr < End) {
    DWARFListType CurrentList;
    uint64_t Off = *OffsetPtr;
    if (Error E = CurrentList.extract(Data, getHeaderOffset(), End, OffsetPtr,
                                      Header.getSectionName(),
                                      Header.getListTypeString()))
      return E;
    ListMap[Off] = CurrentList;
  }

  assert(*OffsetPtr == End &&
         "mismatch between expected length of table and length "
         "of extracted data");
  return Error::success();
}